

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  long lVar1;
  FieldDescriptor FVar2;
  int iVar3;
  iterator iVar4;
  EnumDescriptor *pEVar5;
  long *plVar6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arg;
  long *plVar7;
  FieldDescriptor *pFVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  FieldDescriptor *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((byte)field[1] & 8) != 0) {
    lVar1 = *(long *)(*(long *)(field + 0x20) + 8);
    if ((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
        allowed_proto3_extendees_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                                   allowed_proto3_extendees_abi_cxx11_);
      if (iVar3 != 0) {
        arg = &(anonymous_namespace)::NewAllowedProto3Extendee_abi_cxx11_()->_M_t;
        internal::OnShutdownRun
                  (internal::
                   OnShutdownDelete<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::anon_class_1_0_00000001::__invoke,arg);
        (anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
        allowed_proto3_extendees_abi_cxx11_ = arg;
        __cxa_guard_release(&(anonymous_namespace)::
                             AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                             allowed_proto3_extendees_abi_cxx11_);
      }
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                   allowed_proto3_extendees_abi_cxx11_,(key_type *)(lVar1 + 0x20));
    if ((_Rb_tree_header *)iVar4._M_node ==
        &((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
          allowed_proto3_extendees_abi_cxx11_->_M_impl).super__Rb_tree_header) {
      AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  FVar2 = field[1];
  if (((byte)FVar2 & 0x60) == 0x40) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
    FVar2 = field[1];
  }
  if (((byte)FVar2 & 1) != 0) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_70._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_90 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_70,&local_90)
    ;
  }
  if (field[2] == (FieldDescriptor)0xe) {
    pEVar5 = FieldDescriptor::enum_type(field);
    if (pEVar5 != (EnumDescriptor *)0x0) {
      pEVar5 = FieldDescriptor::enum_type(field);
      if (*(char *)(*(long *)(pEVar5 + 0x10) + 0x3a) != '\x03') {
        pEVar5 = FieldDescriptor::enum_type(field);
        if (*(char *)(*(long *)(pEVar5 + 0x10) + 0x3a) != '\0') {
          lVar1 = *(long *)(field + 8);
          pEVar5 = FieldDescriptor::enum_type(field);
          std::operator+(&local_50,"Enum type \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(pEVar5 + 8) + 0x20));
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_b0 = &local_a0;
          plVar7 = plVar6 + 2;
          if ((long *)*plVar6 == plVar7) {
            local_a0 = *plVar7;
            lStack_98 = plVar6[3];
          }
          else {
            local_a0 = *plVar7;
            local_b0 = (long *)*plVar6;
          }
          local_a8 = plVar6[1];
          *plVar6 = (long)plVar7;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_b0,
                                      *(ulong *)(*(long *)(*(long *)(field + 0x20) + 8) + 0x20));
          pFVar8 = (FieldDescriptor *)(plVar6 + 2);
          if ((FieldDescriptor *)*plVar6 == pFVar8) {
            local_80 = *(long *)pFVar8;
            lStack_78 = plVar6[3];
            local_90 = (FieldDescriptor *)&local_80;
          }
          else {
            local_80 = *(long *)pFVar8;
            local_90 = (FieldDescriptor *)*plVar6;
          }
          local_88 = plVar6[1];
          *plVar6 = (long)pFVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar6 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar6 == paVar9) {
            local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_70.field_2._8_8_ = plVar6[3];
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          }
          else {
            local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_70._M_dataplus._M_p = (pointer)*plVar6;
          }
          local_70._M_string_length = plVar6[1];
          *plVar6 = (long)paVar9;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          AddError(this,(string *)(lVar1 + 0x20),&proto->super_Message,TYPE,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (local_90 != (FieldDescriptor *)&local_80) {
            operator_delete(local_90);
          }
          if (local_b0 != &local_a0) {
            operator_delete(local_b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
      }
    }
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_70._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_90 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_70,&local_90)
    ;
  }
  if (field[2] == (FieldDescriptor)0xa) {
    AddError(this,(string *)(*(long *)(field + 8) + 0x20),&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3 &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_UNKNOWN) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
                 "\" is not a proto3 enum, but is used in \"" +
                 field->containing_type()->full_name() +
                 "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}